

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

CTcSymbol * CTcSymPropBase::read_from_sym_file(CVmFile *fp)

{
  uchar uVar1;
  uint uVar2;
  tc_symtype_t tVar3;
  char *__s;
  CTcSymProp *this;
  CTcSymProp *prop_entry;
  CTcSymbol *old_entry;
  int weak;
  char flags;
  char *sym;
  undefined2 in_stack_ffffffffffffff88;
  tctarg_prop_id_t in_stack_ffffffffffffff8a;
  int in_stack_ffffffffffffff8c;
  CTcPrsSymtab *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  CTcSymPropBase *local_8;
  
  __s = CTcSymbolBase::base_read_from_sym_file
                  ((CVmFile *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (__s == (char *)0x0) {
    local_8 = (CTcSymPropBase *)0x0;
  }
  else {
    uVar1 = CVmFile::read_byte((CVmFile *)in_stack_ffffffffffffff90);
    uVar2 = (int)(char)uVar1 & 4;
    CTcParser::get_global_symtab(G_prs);
    strlen(__s);
    local_8 = (CTcSymPropBase *)
              CTcPrsSymtab::find(in_stack_ffffffffffffff90,
                                 (textchar_t *)
                                 CONCAT44(in_stack_ffffffffffffff8c,
                                          CONCAT22(in_stack_ffffffffffffff8a,
                                                   in_stack_ffffffffffffff88)),0x20da80);
    if (((local_8 == (CTcSymPropBase *)0x0) ||
        (tVar3 = CTcSymbolBase::get_type((CTcSymbolBase *)local_8), tVar3 != TC_SYM_PROP)) &&
       ((local_8 == (CTcSymPropBase *)0x0 || (uVar2 == 0)))) {
      local_8 = (CTcSymPropBase *)CTcSymbolBase::operator_new(0x20dad3);
      this = (CTcSymProp *)strlen(__s);
      CTcGenTarg::new_prop_id(G_cg);
      CTcSymProp::CTcSymProp
                (this,__s,(size_t)local_8,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff8a);
      if (uVar2 != 0) {
        set_weak(local_8,1);
      }
    }
  }
  return &local_8->super_CTcSymbol;
}

Assistant:

CTcSymbol *CTcSymPropBase::read_from_sym_file(CVmFile *fp)
{
    /* read the symbol name */
    const char *sym;
    if ((sym = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read and decode the flags of interest */
    char flags = fp->read_byte();
    int weak = flags & 4;

    /* 
     *   If this property is already defined, this is a harmless redefinition
     *   - every symbol file can define the same property without any
     *   problem.  Indicate the harmless redefinition by returning the
     *   original symbol.  
     */
    CTcSymbol *old_entry = G_prs->get_global_symtab()->find(sym, strlen(sym));
    if (old_entry != 0 && old_entry->get_type() == TC_SYM_PROP)
        return old_entry;

    /* 
     *   if there's an old entry of a different type, and our entry is weak,
     *   the other symbol overrides our property definition 
     */
    if (old_entry != 0 && weak)
        return old_entry;

    /* create and return the new symbol */
    CTcSymProp *prop_entry =
        new CTcSymProp(sym, strlen(sym), FALSE, G_cg->new_prop_id());

    /* if our definition is weak, record that */
    if (weak)
        prop_entry->set_weak(TRUE);

    /* return the new entry */
    return prop_entry;
}